

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O0

void inv_txfm2d_add_facade
               (int32_t *input,uint16_t *output,int stride,int32_t *txfm_buf,TX_TYPE tx_type,
               TX_SIZE tx_size,int bd)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  TX_SIZE tx_size_00;
  int32_t *in_RSI;
  TXFM_2D_FLIP_CFG *in_RDI;
  undefined4 in_R8D;
  int unaff_retaddr;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  int32_t *in_stack_00000010;
  int in_stack_00000020;
  TXFM_2D_FLIP_CFG cfg;
  undefined4 in_stack_ffffffffffffff78;
  
  tx_size_00 = (TX_SIZE)((uint)in_EDX >> 0x18);
  av1_get_inv_txfm_cfg
            ((TX_TYPE)((ulong)in_RCX >> 0x38),(TX_SIZE)((ulong)in_RCX >> 0x30),
             (TXFM_2D_FLIP_CFG *)CONCAT44(in_R8D,in_stack_ffffffffffffff78));
  inv_txfm2d_add_c(in_stack_00000010,(uint16_t *)CONCAT44(in_stack_0000000c,in_stack_00000008),
                   unaff_retaddr,in_RDI,in_RSI,tx_size_00,in_stack_00000020);
  return;
}

Assistant:

static inline void inv_txfm2d_add_facade(const int32_t *input, uint16_t *output,
                                         int stride, int32_t *txfm_buf,
                                         TX_TYPE tx_type, TX_SIZE tx_size,
                                         int bd) {
  TXFM_2D_FLIP_CFG cfg;
  av1_get_inv_txfm_cfg(tx_type, tx_size, &cfg);
  // Forward shift sum uses larger square size, to be consistent with what
  // av1_gen_inv_stage_range() does for inverse shifts.
  inv_txfm2d_add_c(input, output, stride, &cfg, txfm_buf, tx_size, bd);
}